

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlneuron.cxx
# Opt level: O0

string * __thiscall
MlCalciumChannel::getParameter(string *__return_storage_ptr__,MlCalciumChannel *this,string *name)

{
  stringstream local_1a8 [8];
  stringstream param;
  string *name_local;
  MlCalciumChannel *this_local;
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

string MlCalciumChannel::getParameter(const string& name) const
{
	stringstream param;
/*	
	if (name=="reversal-potential") 
		param << dReversal;
	else if (name=="weight")
		param << dWeight;
	else
		param << StochasticFunction::getParameter(name);
*/		
	return param.str();
}